

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstepsolver.cpp
# Opt level: O1

void __thiscall
TPZStepSolver<std::complex<long_double>_>::TPZStepSolver
          (TPZStepSolver<std::complex<long_double>_> *this,
          TPZStepSolver<std::complex<long_double>_> *copy)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  DecomposeType DVar4;
  int iVar5;
  undefined4 extraout_var;
  TPZMatrixSolver<std::complex<long_double>_> *pTVar6;
  
  TPZMatrixSolver<std::complex<long_double>_>::TPZMatrixSolver
            (&this->super_TPZMatrixSolver<std::complex<long_double>_>,&PTR_PTR_01848a90,
             &copy->super_TPZMatrixSolver<std::complex<long_double>_>);
  (this->super_TPZMatrixSolver<std::complex<long_double>_>).super_TPZSolver.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZStepSolver_01848a00;
  this->fNumIterations = copy->fNumIterations;
  std::__cxx11::list<long,_std::allocator<long>_>::list(&this->fSingular,&copy->fSingular);
  DVar4 = copy->fDecompose;
  this->fSolver = copy->fSolver;
  this->fDecompose = DVar4;
  this->fMaxIterations = copy->fMaxIterations;
  uVar1 = *(undefined4 *)((long)&copy->fTol + 4);
  uVar2 = *(undefined4 *)&copy->fOverRelax;
  uVar3 = *(undefined4 *)((long)&copy->fOverRelax + 4);
  *(undefined4 *)&this->fTol = *(undefined4 *)&copy->fTol;
  *(undefined4 *)((long)&this->fTol + 4) = uVar1;
  *(undefined4 *)&this->fOverRelax = uVar2;
  *(undefined4 *)((long)&this->fOverRelax + 4) = uVar3;
  this->fPrecond = (TPZMatrixSolver<std::complex<long_double>_> *)0x0;
  if (copy->fPrecond != (TPZMatrixSolver<std::complex<long_double>_> *)0x0) {
    iVar5 = (*(copy->fPrecond->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[9])();
    if (CONCAT44(extraout_var,iVar5) == 0) {
      pTVar6 = (TPZMatrixSolver<std::complex<long_double>_> *)0x0;
    }
    else {
      pTVar6 = (TPZMatrixSolver<std::complex<long_double>_> *)
               __dynamic_cast(CONCAT44(extraout_var,iVar5),&TPZSolver::typeinfo,
                              &TPZMatrixSolver<std::complex<long_double>>::typeinfo,0);
    }
    this->fPrecond = pTVar6;
  }
  this->fFromCurrent = copy->fFromCurrent;
  this->fNumVectors = copy->fNumVectors;
  return;
}

Assistant:

TPZStepSolver<TVar>::TPZStepSolver(const TPZStepSolver<TVar> & copy) : TPZRegisterClassId(&TPZStepSolver::ClassId),
TPZMatrixSolver<TVar>(copy), fNumIterations(copy.fNumIterations) , fSingular(copy.fSingular){
    fSolver = copy.fSolver;
    fDecompose = copy.fDecompose;
    fMaxIterations = copy.fMaxIterations;
    fTol = copy.fTol;
    fOverRelax = copy.fOverRelax;
    fPrecond = 0;
    if(copy.fPrecond) fPrecond = dynamic_cast<TPZMatrixSolver<TVar>*>(copy.fPrecond->Clone());
    fFromCurrent = copy.fFromCurrent;
    fNumVectors = copy.fNumVectors;//Cedric: 24/04/2003 - 12:39
}